

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O3

void ProtectNoBanConnections
               (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                *eviction_candidates)

{
  long lVar1;
  pointer pNVar2;
  pointer pNVar3;
  pointer pNVar4;
  long lVar5;
  pointer pNVar6;
  long lVar7;
  pointer pNVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pNVar8 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pNVar8 - (long)pNVar2;
  lVar5 = (lVar7 >> 3) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar5) {
    lVar7 = lVar5 + 1;
    pNVar3 = pNVar2 + 2;
    do {
      if (pNVar3[-2].m_noban != false) {
        pNVar3 = pNVar3 + -2;
        goto LAB_00226d0d;
      }
      if (pNVar3[-1].m_noban != false) {
        pNVar3 = pNVar3 + -1;
        goto LAB_00226d0d;
      }
      if (pNVar3->m_noban != false) goto LAB_00226d0d;
      if (pNVar3[1].m_noban != false) {
        pNVar3 = pNVar3 + 1;
        goto LAB_00226d0d;
      }
      lVar7 = lVar7 + -1;
      pNVar3 = pNVar3 + 4;
    } while (1 < lVar7);
    lVar7 = (long)pNVar8 - (long)(pNVar2 + lVar5 * 4);
    pNVar2 = pNVar2 + lVar5 * 4;
  }
  lVar5 = (lVar7 >> 3) * -0x71c71c71c71c71c7;
  if (lVar5 == 1) {
LAB_00226ced:
    pNVar3 = pNVar2;
    if (pNVar2->m_noban == false) {
      pNVar3 = pNVar8;
    }
  }
  else if (lVar5 == 2) {
LAB_00226ce3:
    pNVar3 = pNVar2;
    if (pNVar2->m_noban == false) {
      pNVar2 = pNVar2 + 1;
      goto LAB_00226ced;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_00226d52;
    pNVar3 = pNVar2;
    if (pNVar2->m_noban == false) {
      pNVar2 = pNVar2 + 1;
      goto LAB_00226ce3;
    }
  }
LAB_00226d0d:
  pNVar2 = pNVar3 + 1;
  if (pNVar2 != pNVar8 && pNVar3 != pNVar8) {
    do {
      if (pNVar2->m_noban == false) {
        pNVar4 = pNVar2;
        pNVar6 = pNVar3;
        for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
          pNVar6->id = pNVar4->id;
          pNVar4 = (pointer)&pNVar4->m_connected;
          pNVar6 = (pointer)&pNVar6->m_connected;
        }
        pNVar3 = pNVar3 + 1;
      }
      pNVar2 = pNVar2 + 1;
    } while (pNVar2 != pNVar8);
    pNVar8 = (eviction_candidates->
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pNVar3 != pNVar8) {
    (eviction_candidates->
    super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
    super__Vector_impl_data._M_finish = pNVar3;
  }
LAB_00226d52:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ProtectNoBanConnections(std::vector<NodeEvictionCandidate>& eviction_candidates)
{
    eviction_candidates.erase(std::remove_if(eviction_candidates.begin(), eviction_candidates.end(),
                                             [](NodeEvictionCandidate const& n) {
                                                 return n.m_noban;
                                             }),
                              eviction_candidates.end());
}